

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::UnaryExpr<_duckdb_value_*const_&>::streamReconstructedExpression
          (UnaryExpr<_duckdb_value_*const_&> *this,ostream *os)

{
  _duckdb_value *in_stack_ffffffffffffffc8;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  StringMaker<_duckdb_value_*,_void>::convert<_duckdb_value>(in_stack_ffffffffffffffc8);
  std::__ostream_insert<char,std::char_traits<char>>(os,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }